

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O3

void __thiscall
VPLGrammar::Parser::FunctionDefinitionNode::BuildProgram
          (FunctionDefinitionNode *this,Scope *scope,ostream *out)

{
  pointer pFVar1;
  __uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> _Var2;
  pointer pNVar3;
  ostream *poVar4;
  char local_19;
  
  (**(code **)(*(long *)(((this->super_ASTNodeBasic).children_.
                          super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        ._M_t + 0x28))();
  std::__ostream_insert<char,std::char_traits<char>>(out,"func ",5);
  pFVar1 = (scope->functions_).super__Vector_base<vpl::Function,_std::allocator<vpl::Function>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,pFVar1[-1].name_._M_dataplus._M_p,pFVar1[-1].name_._M_string_length);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_19,1);
  vpl::Scope::SpawnFunctionScope(scope);
  _Var2._M_t.
  super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
  .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
       (this->super_ASTNodeBasic).children_.
       super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
       ._M_t;
  (**(code **)(*(long *)_Var2._M_t.
                        super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
              0x28))(_Var2._M_t.
                     super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                     .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                     out);
  pNVar3 = (scope->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (scope->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar3 + -1;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&pNVar3[-1].offsets_._M_h);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    ret\n",8);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                out << "func " << scope->GetLastFunctionName() << '\n';
                scope->SpawnFunctionScope();
                children_[1]->BuildProgram(scope, out);
                scope->CloseScope();
                out << "    ret\n";
            }